

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O2

void __thiscall HighsDomain::markPropagateCut(HighsDomain *this,Reason reason)

{
  size_type sVar1;
  reference this_00;
  reference this_01;
  uint uVar2;
  
  uVar2 = reason.type;
  if (0xfffffff8 < uVar2) {
    return;
  }
  sVar1 = std::
          deque<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>::
          size(&this->cutpoolpropagation);
  if ((int)uVar2 < (int)sVar1) {
    this_00 = std::
              _Deque_iterator<HighsDomain::CutpoolPropagation,_HighsDomain::CutpoolPropagation_&,_HighsDomain::CutpoolPropagation_*>
              ::operator[](&(this->cutpoolpropagation).
                            super__Deque_base<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
                            ._M_impl.super__Deque_impl_data._M_start,(long)(int)uVar2);
    CutpoolPropagation::markPropagateCut(this_00,reason.index);
    return;
  }
  sVar1 = std::
          deque<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>::
          size(&this->cutpoolpropagation);
  this_01 = std::
            _Deque_iterator<HighsDomain::ConflictPoolPropagation,_HighsDomain::ConflictPoolPropagation_&,_HighsDomain::ConflictPoolPropagation_*>
            ::operator[](&(this->conflictPoolPropagation).
                          super__Deque_base<HighsDomain::ConflictPoolPropagation,_std::allocator<HighsDomain::ConflictPoolPropagation>_>
                          ._M_impl.super__Deque_impl_data._M_start,(long)(int)uVar2 - sVar1);
  ConflictPoolPropagation::markPropagateConflict(this_01,reason.index);
  return;
}

Assistant:

void HighsDomain::markPropagateCut(Reason reason) {
  switch (reason.type) {
    case Reason::kUnknown:
    case Reason::kCliqueTable:
    case Reason::kBranching:
    case Reason::kModelRowLower:
    case Reason::kModelRowUpper:
    case Reason::kConflictingBounds:
    case Reason::kObjective:
      break;
    default:
      assert(reason.type >= 0 &&
             reason.type < HighsInt(cutpoolpropagation.size() +
                                    conflictPoolPropagation.size()));
      if (reason.type < (HighsInt)cutpoolpropagation.size())
        cutpoolpropagation[reason.type].markPropagateCut(reason.index);
      else
        conflictPoolPropagation[reason.type - cutpoolpropagation.size()]
            .markPropagateConflict(reason.index);
  }
}